

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadFuncCos<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadFuncCos<Fad<double>_>_> *pFVar3;
  FadExpr<FadFuncSin<Fad<double>_>_> *pFVar4;
  double *pdVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  value_type vVar11;
  double dVar12;
  double dVar13;
  
  uVar1 = (((fadexpr->fadexpr_).left_)->fadexpr_).expr_.dx_.num_elts;
  uVar2 = (((fadexpr->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar2 != uVar1) {
    if (uVar2 == 0) {
      if (uVar1 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar1 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar2;
      uVar6 = 0xffffffffffffffff;
      if (-1 < (int)uVar2) {
        uVar6 = (long)(int)uVar2 << 3;
      }
      pdVar5 = (double *)operator_new__(uVar6);
      (this->dx_).ptr_to_data = pdVar5;
    }
  }
  if (uVar2 != 0) {
    pdVar5 = (this->dx_).ptr_to_data;
    if (((((fadexpr->fadexpr_).left_)->fadexpr_).expr_.dx_.num_elts == 0) ||
       ((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts == 0)) {
      if (0 < (int)uVar2) {
        uVar6 = 0;
        do {
          vVar11 = FadBinaryMul<FadExpr<FadFuncCos<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
                   ::dx(&fadexpr->fadexpr_,(int)uVar6);
          pdVar5[uVar6] = vVar11;
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
    }
    else if (0 < (int)uVar2) {
      uVar6 = 0;
      do {
        pFVar3 = (fadexpr->fadexpr_).left_;
        dVar12 = (pFVar3->fadexpr_).expr_.dx_.ptr_to_data[uVar6];
        dVar7 = sin((pFVar3->fadexpr_).expr_.val_);
        dVar8 = sin((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.val_);
        pFVar4 = (fadexpr->fadexpr_).right_;
        dVar13 = (pFVar4->fadexpr_).expr_.dx_.ptr_to_data[uVar6];
        dVar9 = cos((pFVar4->fadexpr_).expr_.val_);
        dVar10 = cos((((fadexpr->fadexpr_).left_)->fadexpr_).expr_.val_);
        pdVar5[uVar6] = dVar10 * dVar9 * dVar13 - dVar8 * dVar7 * dVar12;
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
    }
  }
  dVar12 = cos((((fadexpr->fadexpr_).left_)->fadexpr_).expr_.val_);
  dVar13 = sin((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.val_);
  this->val_ = dVar13 * dVar12;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}